

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O3

int mtar_read_header(mtar_t *tar,mtar_header_t *h)

{
  undefined4 uVar1;
  size_t sVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  ulong uVar9;
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  int iVar12;
  size_t sVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint chksum2;
  longlong size;
  mtar_raw_header_t rh;
  int local_234;
  size_t local_230;
  char local_228 [100];
  undefined1 local_1c4 [8];
  undefined1 local_1bc [16];
  undefined1 local_1ac [12];
  undefined1 local_1a0 [12];
  char local_194 [8];
  char local_18c;
  char local_18b [355];
  
  tar->last_header = tar->pos;
  iVar12 = (*tar->read)(tar,local_228,0x200);
  tar->pos = tar->pos + 0x200;
  if (iVar12 == 0) {
    sVar2 = tar->last_header;
    iVar12 = (*tar->seek)(tar,sVar2);
    tar->pos = sVar2;
    if (iVar12 == 0) {
      sVar13 = strlen(local_228);
      iVar12 = -9;
      if (sVar13 < 100) {
        sVar13 = strlen(local_18b);
        if (sVar13 < 100) {
          if (local_194[0] == '\0') {
            iVar12 = -7;
          }
          else {
            iVar12 = 0x100;
            iVar15 = 0;
            iVar16 = 0;
            iVar17 = 0;
            lVar14 = 0;
            do {
              uVar1 = *(undefined4 *)(local_228 + lVar14);
              uVar9 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
              auVar3._8_4_ = 0;
              auVar3._0_8_ = uVar9;
              auVar3[0xc] = (char)((uint)uVar1 >> 0x18);
              auVar4[8] = (char)((uint)uVar1 >> 0x10);
              auVar4._0_8_ = uVar9;
              auVar4[9] = 0;
              auVar4._10_3_ = auVar3._10_3_;
              auVar10._5_8_ = 0;
              auVar10._0_5_ = auVar4._8_5_;
              auVar5[4] = (char)((uint)uVar1 >> 8);
              auVar5._0_4_ = (int)uVar9;
              auVar5[5] = 0;
              auVar5._6_7_ = SUB137(auVar10 << 0x40,6);
              iVar12 = iVar12 + (int)uVar9;
              iVar15 = iVar15 + auVar5._4_4_;
              iVar16 = iVar16 + auVar4._8_4_;
              iVar17 = iVar17 + (uint)(uint3)(auVar3._10_3_ >> 0x10);
              lVar14 = lVar14 + 4;
            } while (lVar14 != 0x94);
            iVar15 = iVar17 + iVar15 + iVar16 + iVar12;
            iVar16 = 0;
            iVar17 = 0;
            iVar18 = 0;
            lVar14 = 0x9c;
            do {
              uVar1 = *(undefined4 *)(local_228 + lVar14);
              uVar9 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
              auVar6._8_4_ = 0;
              auVar6._0_8_ = uVar9;
              auVar6[0xc] = (char)((uint)uVar1 >> 0x18);
              auVar7[8] = (char)((uint)uVar1 >> 0x10);
              auVar7._0_8_ = uVar9;
              auVar7[9] = 0;
              auVar7._10_3_ = auVar6._10_3_;
              auVar11._5_8_ = 0;
              auVar11._0_5_ = auVar7._8_5_;
              auVar8[4] = (char)((uint)uVar1 >> 8);
              auVar8._0_4_ = (int)uVar9;
              auVar8[5] = 0;
              auVar8._6_7_ = SUB137(auVar11 << 0x40,6);
              iVar15 = iVar15 + (int)uVar9;
              iVar16 = iVar16 + auVar8._4_4_;
              iVar17 = iVar17 + auVar7._8_4_;
              iVar18 = iVar18 + (uint)(uint3)(auVar6._10_3_ >> 0x10);
              lVar14 = lVar14 + 4;
            } while (lVar14 != 0x200);
            __isoc99_sscanf(local_194,"%7o",&local_234);
            iVar12 = -6;
            if (iVar18 + iVar16 + iVar17 + iVar15 == local_234) {
              __isoc99_sscanf(local_1c4,"%7o",h);
              __isoc99_sscanf(local_1bc,"%7o",&h->owner);
              local_230 = 0;
              __isoc99_sscanf(local_1ac,"%11llo",&local_230);
              h->size = local_230;
              __isoc99_sscanf(local_1a0,"%11o",&h->mtime);
              h->type = (int)local_18c;
              iVar12 = -10;
              if (h->size >> 0x21 == 0) {
                strcpy(h->name,local_228);
                strcpy(h->linkname,local_18b);
                iVar12 = 0;
              }
            }
          }
        }
      }
    }
  }
  return iVar12;
}

Assistant:

int mtar_read_header(mtar_t *tar, mtar_header_t *h) {
  int err;
  mtar_raw_header_t rh;
  /* Save header position */
  tar->last_header = tar->pos;
  /* Read raw header */
  err = mtar_tread(tar, &rh, sizeof(rh));
  if (err) {
    return err;
  }
  /* Seek back to start of header */
  err = mtar_seek(tar, tar->last_header);
  if (err) {
    return err;
  }
  /* Load raw header into header struct and return */
  return mtar_raw_to_header(h, &rh);
}